

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TagDeclaration_Enum.h
# Opt level: O1

void __thiscall psy::C::EnumDeclarationSymbol::~EnumDeclarationSymbol(EnumDeclarationSymbol *this)

{
  pointer ppMVar1;
  
  (this->super_TagDeclarationSymbol).super_TypeDeclarationSymbol.super_DeclarationSymbol.
  super_Symbol._vptr_Symbol = (_func_int **)&PTR__TagDeclarationSymbol_00539608;
  ppMVar1 = (this->super_TagDeclarationSymbol).membDecls_.
            super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar1 != (pointer)0x0) {
    operator_delete(ppMVar1,(long)(this->super_TagDeclarationSymbol).membDecls_.
                                  super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppMVar1
                   );
  }
  TypeDeclarationSymbol::~TypeDeclarationSymbol((TypeDeclarationSymbol *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

class PSY_C_API EnumDeclarationSymbol final : public TagDeclarationSymbol
{
public:
    //!@{
    /**
     * Cast \c this Symbol as a EnumDeclarationSymbol.
     */
    virtual EnumDeclarationSymbol* asEnumDeclaration() override { return this; }
    virtual const EnumDeclarationSymbol* asEnumDeclaration() const override { return this; }
    //!@}

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(DeclarationBinder);

    EnumDeclarationSymbol(
            const Symbol* containingSym,
            const SyntaxTree* tree,
            const Scope* enclosingScope,
            TagType* tagTy);

    void addEnumerator(const EnumeratorDeclarationSymbol* enumerator);
}